

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cpp
# Opt level: O0

void __thiscall Bind::Bind(Bind *this,BindData *bind_data)

{
  const_pointer local_28;
  const_pointer local_20;
  BindData *local_18;
  BindData *bind_data_local;
  Bind *this_local;
  
  local_18 = bind_data;
  bind_data_local = (BindData *)this;
  local_20 = PlainString<4096UL>::c_str(&bind_data->inside_);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&this->inside_,&local_20,auto_format);
  local_28 = PlainString<4096UL>::c_str(&local_18->outside_);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&this->outside_,&local_28,auto_format);
  this->flags_ = local_18->flags_;
  this->mounted_ = false;
  std::filesystem::__cxx11::path::path(&this->from_);
  std::filesystem::__cxx11::path::path(&this->to_);
  return;
}

Assistant:

Bind::Bind(const BindData *bind_data)
    : inside_(bind_data->inside_.c_str()), outside_(bind_data->outside_.c_str()), flags_(bind_data->flags_) {}